

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-time-dependent.h
# Opt level: O1

void __thiscall
dynamicgraph::
SignalTimeDependent<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
::SignalTimeDependent
          (SignalTimeDependent<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
           *this,SignalArray_const<int> *arr,string *name)

{
  pointer pcVar1;
  string local_48;
  
  pcVar1 = (name->_M_dataplus)._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + name->_M_string_length);
  Signal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  Signal((Signal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
          *)&this->field_0x40,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  (this->super_TimeDependency<int>)._vptr_TimeDependency = (_func_int **)0x1297a8;
  *(undefined8 *)&this->field_0x40 = 0x129918;
  TimeDependency<int>::TimeDependency
            (&this->super_TimeDependency<int>,(SignalBase<int> *)&this->field_0x40,arr,
             TIME_DEPENDENT);
  (this->super_TimeDependency<int>)._vptr_TimeDependency = (_func_int **)0x1297a8;
  *(undefined8 *)&this->field_0x40 = 0x129918;
  return;
}

Assistant:

SignalTimeDependent<T, Time>::SignalTimeDependent(
    const SignalArray_const<Time> &arr, std::string name)
    : Signal<T, Time>(name), TimeDependency<Time>(this, arr) {}